

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

void __thiscall
TMatrix3x3<double>::TMatrix3x3(TMatrix3x3<double> *this,Vector3 *axis,double c,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double v;
  double u;
  double tyy;
  double txx;
  double ty;
  double tx;
  double sz;
  double sy;
  double sx;
  double t;
  double s_local;
  double c_local;
  Vector3 *axis_local;
  TMatrix3x3<double> *this_local;
  
  dVar1 = 1.0 - c;
  dVar2 = s * axis->X;
  dVar3 = s * axis->Y;
  dVar4 = s * axis->Z;
  dVar5 = dVar1 * axis->X;
  dVar6 = dVar5 * axis->X;
  this->Cells[0][0] = dVar6 + c;
  dVar7 = dVar5 * axis->Y;
  this->Cells[0][1] = dVar7 - dVar4;
  dVar5 = dVar5 * axis->Z;
  this->Cells[0][2] = dVar5 + dVar3;
  dVar8 = dVar1 * axis->Y;
  this->Cells[1][0] = dVar7 + dVar4;
  dVar4 = dVar8 * axis->Y;
  this->Cells[1][1] = dVar4 + c;
  dVar8 = dVar8 * axis->Z;
  this->Cells[1][2] = dVar8 - dVar2;
  this->Cells[2][0] = dVar5 - dVar3;
  this->Cells[2][1] = dVar8 + dVar2;
  this->Cells[2][2] = ((dVar1 - dVar6) - dVar4) + c;
  return;
}

Assistant:

TMatrix3x3(const Vector3 &axis, double c/*cosine*/, double s/*sine*/)
	{
		double t = 1 - c;
		double sx = s*axis.X, sy = s*axis.Y, sz = s*axis.Z;
		double tx, ty, txx, tyy, u, v;

		tx = t*axis.X;
		Cells[0][0] = vec_t( (txx=tx*axis.X) + c );
		Cells[0][1] = vec_t(   (u=tx*axis.Y) - sz);
		Cells[0][2] = vec_t(   (v=tx*axis.Z) + sy);

		ty = t*axis.Y;
		Cells[1][0] = vec_t(              u  + sz);
		Cells[1][1] = vec_t( (tyy=ty*axis.Y) + c );
		Cells[1][2] = vec_t(   (u=ty*axis.Z) - sx);

		Cells[2][0] = vec_t(              v  - sy);
		Cells[2][1] = vec_t(              u  + sx);
		Cells[2][2] = vec_t(     (t-txx-tyy) + c );
	}